

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O3

int forkfd_wait4(int ffd,forkfd_info *info,int options,rusage *rusage)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  ssize_t sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long in_FS_OFFSET;
  pipe_payload payload;
  forkfd_info local_150;
  undefined1 local_148 [144];
  undefined4 local_b8;
  undefined4 uStack_b4;
  int32_t iStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  int32_t iStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_150,0xaa,0x98);
  if (0 < system_forkfd_state) {
    uVar5 = (options & 2U) * 0x800000;
    uVar6 = (options & 1U) + uVar5 + 4;
    uVar7 = uVar6;
    if ((options & 1U) == 0) {
      uVar1 = fcntl(ffd,3);
      if (uVar1 != 0xffffffff) {
        uVar7 = uVar5 | 5;
        if ((uVar1 >> 0xb & 1) == 0) {
          uVar7 = uVar6;
        }
        goto LAB_0043a996;
      }
    }
    else {
LAB_0043a996:
      local_b8 = 0xaaaaaaaa;
      uStack_b4 = 0xaaaaaaaa;
      uStack_ac = 0xaaaaaaaa;
      local_a8 = 0xaaaaaaaa;
      uStack_a4 = 0xaaaaaaaa;
      uStack_9c = 0xaaaaaaaa;
      local_48 = 0xaaaaaaaa;
      uStack_44 = 0xaaaaaaaa;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      local_58 = 0xaaaaaaaa;
      uStack_54 = 0xaaaaaaaa;
      uStack_50 = 0xaaaaaaaa;
      uStack_4c = 0xaaaaaaaa;
      local_68 = 0xaaaaaaaa;
      uStack_64 = 0xaaaaaaaa;
      uStack_60 = 0xaaaaaaaa;
      uStack_5c = 0xaaaaaaaa;
      local_78 = 0xaaaaaaaa;
      uStack_74 = 0xaaaaaaaa;
      uStack_70 = 0xaaaaaaaa;
      uStack_6c = 0xaaaaaaaa;
      local_88 = 0xaaaaaaaa;
      uStack_84 = 0xaaaaaaaa;
      uStack_80 = 0xaaaaaaaa;
      uStack_7c = 0xaaaaaaaa;
      local_98 = 0xaaaaaaaa;
      uStack_94 = 0xaaaaaaaa;
      uStack_90 = 0xaaaaaaaa;
      uStack_8c = 0xaaaaaaaa;
      iStack_b0 = 0;
      iStack_a0 = 0;
      lVar2 = syscall(0xf7,3,ffd,&local_b8,(ulong)uVar7,rusage);
      if (info != (forkfd_info *)0x0) {
        info->code = iStack_b0;
        info->status = iStack_a0;
      }
      iVar8 = (int)lVar2;
      if ((int)lVar2 != -1) goto LAB_0043aa5b;
    }
    piVar3 = __errno_location();
    iVar8 = -1;
    if (*piVar3 != 9) goto LAB_0043aa5b;
  }
  sVar4 = read(ffd,&local_150,0x98);
  iVar8 = -1;
  if ((int)sVar4 != -1) {
    if (info != (forkfd_info *)0x0) {
      *info = local_150;
    }
    iVar8 = 0;
    if (rusage != (rusage *)0x0) {
      memcpy(rusage,local_148,0x90);
      iVar8 = 0;
    }
  }
LAB_0043aa5b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

int forkfd_wait4(int ffd, struct forkfd_info *info, int options, struct rusage *rusage)
{
    struct pipe_payload payload;
    int ret;

    if (system_has_forkfd()) {
        /* if this is one of our pipes, not a procdesc/pidfd, we'll get an EBADF */
        ret = system_forkfd_wait(ffd, info, options, rusage);
        if (disable_fork_fallback() || ret != -1 || errno != EBADF)
            return ret;
    }

    ret = read(ffd, &payload, sizeof(payload));
    if (ret == -1)
        return ret;     /* pass errno, probably EINTR, EBADF or EWOULDBLOCK */

    assert(ret == sizeof(payload));
    if (info)
        *info = payload.info;
    if (rusage)
        *rusage = payload.rusage;

    return 0;           /* success */
}